

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackinghelpers.h
# Opt level: O0

void duckdb_fastpforlib::fastunpack(uint32_t *in,uint32_t *out,uint32_t bit)

{
  logic_error *this;
  undefined4 in_EDX;
  uint *in_RSI;
  uint *in_RDI;
  
  switch(in_EDX) {
  case 0:
    duckdb_fastpforlib::internal::__fastunpack0(in_RDI,in_RSI);
    break;
  case 1:
    duckdb_fastpforlib::internal::__fastunpack1(in_RDI,in_RSI);
    break;
  case 2:
    duckdb_fastpforlib::internal::__fastunpack2(in_RDI,in_RSI);
    break;
  case 3:
    duckdb_fastpforlib::internal::__fastunpack3(in_RDI,in_RSI);
    break;
  case 4:
    duckdb_fastpforlib::internal::__fastunpack4(in_RDI,in_RSI);
    break;
  case 5:
    duckdb_fastpforlib::internal::__fastunpack5(in_RDI,in_RSI);
    break;
  case 6:
    duckdb_fastpforlib::internal::__fastunpack6(in_RDI,in_RSI);
    break;
  case 7:
    duckdb_fastpforlib::internal::__fastunpack7(in_RDI,in_RSI);
    break;
  case 8:
    duckdb_fastpforlib::internal::__fastunpack8(in_RDI,in_RSI);
    break;
  case 9:
    duckdb_fastpforlib::internal::__fastunpack9(in_RDI,in_RSI);
    break;
  case 10:
    duckdb_fastpforlib::internal::__fastunpack10(in_RDI,in_RSI);
    break;
  case 0xb:
    duckdb_fastpforlib::internal::__fastunpack11(in_RDI,in_RSI);
    break;
  case 0xc:
    duckdb_fastpforlib::internal::__fastunpack12(in_RDI,in_RSI);
    break;
  case 0xd:
    duckdb_fastpforlib::internal::__fastunpack13(in_RDI,in_RSI);
    break;
  case 0xe:
    duckdb_fastpforlib::internal::__fastunpack14(in_RDI,in_RSI);
    break;
  case 0xf:
    duckdb_fastpforlib::internal::__fastunpack15(in_RDI,in_RSI);
    break;
  case 0x10:
    duckdb_fastpforlib::internal::__fastunpack16(in_RDI,in_RSI);
    break;
  case 0x11:
    duckdb_fastpforlib::internal::__fastunpack17(in_RDI,in_RSI);
    break;
  case 0x12:
    duckdb_fastpforlib::internal::__fastunpack18(in_RDI,in_RSI);
    break;
  case 0x13:
    duckdb_fastpforlib::internal::__fastunpack19(in_RDI,in_RSI);
    break;
  case 0x14:
    duckdb_fastpforlib::internal::__fastunpack20(in_RDI,in_RSI);
    break;
  case 0x15:
    duckdb_fastpforlib::internal::__fastunpack21(in_RDI,in_RSI);
    break;
  case 0x16:
    duckdb_fastpforlib::internal::__fastunpack22(in_RDI,in_RSI);
    break;
  case 0x17:
    duckdb_fastpforlib::internal::__fastunpack23(in_RDI,in_RSI);
    break;
  case 0x18:
    duckdb_fastpforlib::internal::__fastunpack24(in_RDI,in_RSI);
    break;
  case 0x19:
    duckdb_fastpforlib::internal::__fastunpack25(in_RDI,in_RSI);
    break;
  case 0x1a:
    duckdb_fastpforlib::internal::__fastunpack26(in_RDI,in_RSI);
    break;
  case 0x1b:
    duckdb_fastpforlib::internal::__fastunpack27(in_RDI,in_RSI);
    break;
  case 0x1c:
    duckdb_fastpforlib::internal::__fastunpack28(in_RDI,in_RSI);
    break;
  case 0x1d:
    duckdb_fastpforlib::internal::__fastunpack29(in_RDI,in_RSI);
    break;
  case 0x1e:
    duckdb_fastpforlib::internal::__fastunpack30(in_RDI,in_RSI);
    break;
  case 0x1f:
    duckdb_fastpforlib::internal::__fastunpack31(in_RDI,in_RSI);
    break;
  case 0x20:
    duckdb_fastpforlib::internal::__fastunpack32(in_RDI,in_RSI);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid bit width for bitpacking");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

inline void fastunpack(const uint32_t *__restrict in,
                       uint32_t *__restrict out, const uint32_t bit) {
  // Could have used function pointers instead of switch.
  // Switch calls do offer the compiler more opportunities for optimization in
  // theory. In this case, it makes no difference with a good compiler.
  switch (bit) {
  case 0:
    internal::__fastunpack0(in, out);
    break;
  case 1:
    internal::__fastunpack1(in, out);
    break;
  case 2:
    internal::__fastunpack2(in, out);
    break;
  case 3:
    internal::__fastunpack3(in, out);
    break;
  case 4:
    internal::__fastunpack4(in, out);
    break;
  case 5:
    internal::__fastunpack5(in, out);
    break;
  case 6:
    internal::__fastunpack6(in, out);
    break;
  case 7:
    internal::__fastunpack7(in, out);
    break;
  case 8:
    internal::__fastunpack8(in, out);
    break;
  case 9:
    internal::__fastunpack9(in, out);
    break;
  case 10:
    internal::__fastunpack10(in, out);
    break;
  case 11:
    internal::__fastunpack11(in, out);
    break;
  case 12:
    internal::__fastunpack12(in, out);
    break;
  case 13:
    internal::__fastunpack13(in, out);
    break;
  case 14:
    internal::__fastunpack14(in, out);
    break;
  case 15:
    internal::__fastunpack15(in, out);
    break;
  case 16:
    internal::__fastunpack16(in, out);
    break;
  case 17:
    internal::__fastunpack17(in, out);
    break;
  case 18:
    internal::__fastunpack18(in, out);
    break;
  case 19:
    internal::__fastunpack19(in, out);
    break;
  case 20:
    internal::__fastunpack20(in, out);
    break;
  case 21:
    internal::__fastunpack21(in, out);
    break;
  case 22:
    internal::__fastunpack22(in, out);
    break;
  case 23:
    internal::__fastunpack23(in, out);
    break;
  case 24:
    internal::__fastunpack24(in, out);
    break;
  case 25:
    internal::__fastunpack25(in, out);
    break;
  case 26:
    internal::__fastunpack26(in, out);
    break;
  case 27:
    internal::__fastunpack27(in, out);
    break;
  case 28:
    internal::__fastunpack28(in, out);
    break;
  case 29:
    internal::__fastunpack29(in, out);
    break;
  case 30:
    internal::__fastunpack30(in, out);
    break;
  case 31:
    internal::__fastunpack31(in, out);
    break;
  case 32:
    internal::__fastunpack32(in, out);
    break;
  default:
    throw std::logic_error("Invalid bit width for bitpacking");
  }
}